

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

char * get_ARB1_srcarg_varname(Context *ctx,size_t idx,char *buf,size_t buflen)

{
  char *pcVar1;
  size_t in_R8;
  char regnum_str [16];
  char acStack_28 [24];
  
  pcVar1 = get_D3D_register_string
                     (ctx,ctx->source_args[idx].regtype,ctx->source_args[idx].regnum,acStack_28,
                      in_R8);
  snprintf(buf,0x40,"%s%s",pcVar1,acStack_28);
  return buf;
}

Assistant:

static const char *get_ARB1_srcarg_varname(Context *ctx, const size_t idx,
                                           char *buf, const size_t buflen)
{
    if (idx >= STATICARRAYLEN(ctx->source_args))
    {
        fail(ctx, "Too many source args");
        *buf = '\0';
        return buf;
    } // if

    const SourceArgInfo *arg = &ctx->source_args[idx];
    return get_ARB1_varname_in_buf(ctx, arg->regtype, arg->regnum, buf, buflen);
}